

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::tx_no_inputs::test_method(tx_no_inputs *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar5;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char **local_168;
  assertion_result local_160;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  CMutableTransaction empty;
  CTransaction local_f0;
  TxValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&empty);
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17b;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  CTransaction::CTransaction(&local_f0,&empty);
  bVar2 = CheckTransaction(&local_f0,&state);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01149010;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = (char **)0xc541ad;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_188 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,&local_180,1,1,WARN,_cVar5,(size_t)&local_190,0x17b);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  CTransaction::~CTransaction(&local_f0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17c;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  std::__cxx11::string::string
            ((string *)&local_f0,&state.super_ValidationState<TxValidationResult>.m_reject_reason);
  local_160.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"bad-txns-vin-empty");
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = &local_1c0;
  local_1c0 = "state.GetRejectReason() == \"bad-txns-vin-empty\"";
  local_1b8 = "";
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,&local_180,1,0,WARN,0xc53f90,(size_t)&stack0xfffffffffffffe30,0x17c);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  std::__cxx11::string::~string((string *)&local_f0);
  ValidationState<TxValidationResult>::~ValidationState
            (&state.super_ValidationState<TxValidationResult>);
  CMutableTransaction::~CMutableTransaction(&empty);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_no_inputs)
{
    CMutableTransaction empty;

    TxValidationState state;
    BOOST_CHECK_MESSAGE(!CheckTransaction(CTransaction(empty), state), "Transaction with no inputs should be invalid.");
    BOOST_CHECK(state.GetRejectReason() == "bad-txns-vin-empty");
}